

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O0

double * __thiscall deci::parser_t::value_type::as<double>(value_type *this)

{
  bool bVar1;
  double *pdVar2;
  value_type *this_local;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O0/iec61131.y.hpp"
                  ,0x136,"T &deci::parser_t::value_type::as() [T = double]");
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&double::typeinfo);
  if (!bVar1) {
    __assert_fail("*yytypeid_ == typeid (T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O0/iec61131.y.hpp"
                  ,0x137,"T &deci::parser_t::value_type::as() [T = double]");
  }
  pdVar2 = yyas_<double>(this);
  return pdVar2;
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      YY_ASSERT (yytypeid_);
      YY_ASSERT (*yytypeid_ == typeid (T));
      YY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }